

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLog::WriteAlter(WriteAheadLog *this,CatalogEntry *entry,AlterInfo *info)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  UniqueConstraint *this_01;
  CatalogEntry *pCVar3;
  undefined4 extraout_var;
  DataTableInfo *pDVar4;
  string name;
  WriteAheadLogSerializer serializer;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&serializer,this,ALTER_INFO);
  name._M_dataplus._M_p = (pointer)info;
  Serializer::WriteProperty<duckdb::AlterInfo_const*>
            (&serializer.serializer.super_Serializer,0x65,"info",(AlterInfo **)&name);
  bVar1 = AlterInfo::IsAddPrimaryKey(info);
  if (bVar1) {
    this_00 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
              operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                          *)(info + 1));
    this_01 = Constraint::Cast<duckdb::UniqueConstraint>(this_00);
    pCVar3 = CatalogEntry::Parent(entry);
    iVar2 = (*pCVar3->_vptr_CatalogEntry[0x10])(pCVar3);
    pDVar4 = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                       ((shared_ptr<duckdb::DataTableInfo,_true> *)
                        (CONCAT44(extraout_var,iVar2) + 0x18));
    UniqueConstraint::GetName(&name,this_01,&pCVar3->name);
    SerializeIndex(this->database,&serializer,&pDVar4->indexes,&name);
    WriteAheadLogSerializer::End(&serializer);
    ::std::__cxx11::string::~string((string *)&name);
  }
  else {
    WriteAheadLogSerializer::End(&serializer);
  }
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&serializer);
  return;
}

Assistant:

void WriteAheadLog::WriteAlter(CatalogEntry &entry, const AlterInfo &info) {
	WriteAheadLogSerializer serializer(*this, WALType::ALTER_INFO);
	serializer.WriteProperty(101, "info", &info);

	if (!info.IsAddPrimaryKey()) {
		return serializer.End();
	}

	auto &table_info = info.Cast<AlterTableInfo>();
	auto &constraint_info = table_info.Cast<AddConstraintInfo>();
	auto &unique = constraint_info.constraint->Cast<UniqueConstraint>();

	auto &table_entry = entry.Cast<DuckTableEntry>();
	auto &parent = table_entry.Parent().Cast<DuckTableEntry>();
	auto &parent_info = parent.GetStorage().GetDataTableInfo();
	auto &list = parent_info->GetIndexes();

	auto name = unique.GetName(parent.name);
	SerializeIndex(database, serializer, list, name);
	serializer.End();
}